

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O2

bool __thiscall
QMimeBinaryProvider::matchSuffixTree
          (QMimeBinaryProvider *this,QMimeGlobMatchResult *result,CacheFile *cacheFile,
          int numEntries,int firstOffset,QString *fileName,qsizetype charPos,bool caseSensitiveCheck
          )

{
  char16_t cVar1;
  uchar *puVar2;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  char16_t cVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  QStringView local_a0;
  QStringBuilder<char16_t,_QStringView> local_90;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_60;
  QLatin1String local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = (fileName->d).ptr[charPos];
  iVar6 = 0;
  do {
    while( true ) {
      if (numEntries <= iVar6) {
        bVar4 = false;
        goto LAB_00448f7b;
      }
      uVar5 = iVar6 + (numEntries - 1U) >> 1;
      puVar2 = cacheFile->data;
      lVar8 = (long)(int)(uVar5 * 0xc + firstOffset);
      cVar9 = (ushort)(byte)((uint)*(undefined4 *)(puVar2 + lVar8) >> 0x18) |
              (ushort)((uint)*(undefined4 *)(puVar2 + lVar8) >> 8) & 0xff00;
      if ((ushort)cVar1 <= (ushort)cVar9) break;
      iVar6 = uVar5 + 1;
    }
    numEntries = uVar5;
  } while ((ushort)cVar1 < (ushort)cVar9);
  uVar5 = *(uint *)(puVar2 + lVar8 + 4);
  uVar7 = *(uint *)(puVar2 + lVar8 + 8);
  uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  uVar10 = 0;
  bVar3 = false;
  if (1 < charPos) {
    bVar3 = matchSuffixTree(this,result,cacheFile,uVar5,uVar7,fileName,charPos + -1,
                            caseSensitiveCheck);
    bVar4 = true;
    if (bVar3) goto LAB_00448f7b;
  }
  lVar8 = (long)(int)uVar7;
  if (0 < (int)uVar5) {
    uVar10 = (ulong)uVar5;
  }
  bVar4 = bVar3;
  while( true ) {
    bVar3 = uVar10 == 0;
    uVar10 = uVar10 - 1;
    if ((bVar3) || (puVar2 = cacheFile->data, *(int *)(puVar2 + lVar8) != 0)) break;
    uVar5 = *(uint *)(puVar2 + lVar8 + 4);
    local_48.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.m_data = &DAT_aaaaaaaaaaaaaaaa;
    QLatin1String::QLatin1String
              (&local_48,
               (char *)(puVar2 + (int)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 |
                                       (uVar5 & 0xff00) << 8 | uVar5 << 0x18)));
    latin1.m_data = local_48.m_data;
    latin1.m_size = local_48.m_size;
    QString::QString((QString *)&local_60,latin1);
    bVar3 = QMimeProviderBase::isMimeTypeGlobsExcluded
                      (&this->super_QMimeProviderBase,(QString *)&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    if ((!bVar3) &&
       (uVar5 = *(uint *)(cacheFile->data + lVar8 + 8),
       (!caseSensitiveCheck & (byte)(uVar5 >> 0x10)) == 0)) {
      latin1_00.m_data = local_48.m_data;
      latin1_00.m_size = local_48.m_size;
      QString::QString((QString *)&local_60,latin1_00);
      local_a0.m_data = (fileName->d).ptr;
      local_a0.m_size = (fileName->d).size;
      local_90.b = QStringView::mid(&local_a0,charPos,-1);
      local_90.a = L'*';
      QStringBuilder<char16_t,_QStringView>::convertTo<QString>((QString *)&local_78,&local_90);
      QMimeGlobMatchResult::addMatch
                (result,(QString *)&local_60,uVar5 >> 0x18,(QString *)&local_78,
                 (fileName->d).size + ~charPos);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
      bVar4 = true;
    }
    lVar8 = lVar8 + 0xc;
  }
LAB_00448f7b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QMimeBinaryProvider::matchSuffixTree(QMimeGlobMatchResult &result,
                                          QMimeBinaryProvider::CacheFile *cacheFile, int numEntries,
                                          int firstOffset, const QString &fileName,
                                          qsizetype charPos, bool caseSensitiveCheck)
{
    QChar fileChar = fileName[charPos];
    int min = 0;
    int max = numEntries - 1;
    while (min <= max) {
        const int mid = (min + max) / 2;
        const int off = firstOffset + 12 * mid;
        const QChar ch = char16_t(cacheFile->getUint32(off));
        if (ch < fileChar)
            min = mid + 1;
        else if (ch > fileChar)
            max = mid - 1;
        else {
            --charPos;
            int numChildren = cacheFile->getUint32(off + 4);
            int childrenOffset = cacheFile->getUint32(off + 8);
            bool success = false;
            if (charPos > 0)
                success = matchSuffixTree(result, cacheFile, numChildren, childrenOffset, fileName, charPos, caseSensitiveCheck);
            if (!success) {
                for (int i = 0; i < numChildren; ++i) {
                    const int childOff = childrenOffset + 12 * i;
                    const int mch = cacheFile->getUint32(childOff);
                    if (mch != 0)
                        break;
                    const int mimeTypeOffset = cacheFile->getUint32(childOff + 4);
                    const QLatin1StringView mimeType(cacheFile->getCharStar(mimeTypeOffset));
                    if (isMimeTypeGlobsExcluded(mimeType))
                        continue;
                    const int flagsAndWeight = cacheFile->getUint32(childOff + 8);
                    const int weight = flagsAndWeight & 0xff;
                    const bool caseSensitive = flagsAndWeight & 0x100;
                    if (caseSensitiveCheck || !caseSensitive) {
                        result.addMatch(mimeType, weight,
                                        u'*' + QStringView{ fileName }.mid(charPos + 1),
                                        fileName.size() - charPos - 2);
                        success = true;
                    }
                }
            }
            return success;
        }
    }
    return false;
}